

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

TemporalVariableLookupPtr __thiscall
Lodtalk::LocalScope::addArgument(LocalScope *this,Oop symbol,Node *localContext)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *this_00;
  element_type *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pair<std::_Rb_tree_iterator<std::pair<const_Lodtalk::OopRef,_std::shared_ptr<Lodtalk::VariableLookup>_>_>,_bool>
  pVar3;
  TemporalVariableLookupPtr TVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_40;
  element_type *local_38;
  
  this_00 = (element_type *)operator_new(0x30);
  (this_00->parentScope).super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x100000001;
  this_00->_vptr_EvaluationScope = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164cb0;
  p_Var1 = &(this_00->parentScope).
            super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  (this_00->parentScope).super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__VariableLookup_00164d00;
  this_00[1]._vptr_EvaluationScope = (_func_int **)0xffffffffffffffff;
  this_00[1].parentScope.super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RCX;
  *(undefined2 *)
   &this_00[1].parentScope.super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = 0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(this_00->parentScope).
             super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(int *)&(this_00->parentScope).
                  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
         1;
    UNLOCK();
  }
  else {
    *(_Atomic_word *)
     &(this_00->parentScope).
      super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 2;
  }
  local_48 = (anon_union_8_4_0eb573b0_for_Oop_0)localContext;
  local_40 = p_Var1;
  local_38 = this_00;
  pVar3 = std::
          _Rb_tree<Lodtalk::OopRef,std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>,std::_Select1st<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>,std::less<Lodtalk::OopRef>,std::allocator<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>>
          ::
          _M_emplace_unique<std::pair<Lodtalk::Oop,std::shared_ptr<Lodtalk::TemporalVariableLookup>>>
                    ((_Rb_tree<Lodtalk::OopRef,std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>,std::_Select1st<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>,std::less<Lodtalk::OopRef>,std::allocator<std::pair<Lodtalk::OopRef_const,std::shared_ptr<Lodtalk::VariableLookup>>>>
                      *)((long)symbol.field_0 + 0x18),
                     (pair<Lodtalk::Oop,_std::shared_ptr<Lodtalk::TemporalVariableLookup>_> *)
                     &local_48);
  _Var2._M_pi = pVar3._8_8_;
  if (local_38 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    _Var2._M_pi = extraout_RDX;
  }
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (this->super_EvaluationScope)._vptr_EvaluationScope = (_func_int **)0x0;
    (this->super_EvaluationScope).parentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    (this->super_EvaluationScope)._vptr_EvaluationScope = (_func_int **)p_Var1;
    (this->super_EvaluationScope).parentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
    this_00 = (element_type *)0x0;
  }
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    _Var2._M_pi = extraout_RDX_00;
  }
  TVar4.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  TVar4.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TemporalVariableLookupPtr)
         TVar4.super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TemporalVariableLookupPtr LocalScope::addArgument(Oop symbol, Node *localContext)
{
	auto variable = std::make_shared<TemporalVariableLookup> (localContext, false);
	if(variables.insert(std::make_pair(symbol, variable)).second)
        return variable;
    return TemporalVariableLookupPtr();
}